

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Free(Extension *this)

{
  byte bVar1;
  Arena *pAVar2;
  Rep *pRVar3;
  LogMessage *pLVar4;
  string *this_00;
  ulong uVar5;
  LogFinisher local_59;
  LogMessage local_58;
  
  bVar1 = this->type;
  if (this->is_repeated != true) {
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar4 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_59,pLVar4);
      LogMessage::~LogMessage(&local_58);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) == 10) {
      if ((this->field_0).repeated_string_value ==
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0) {
        return;
      }
      (**(code **)((((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_ + 8)
      )();
      return;
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 9) {
      return;
    }
    this_00 = (string *)(this->field_0).repeated_string_value;
    if (this_00 == (string *)0x0) {
      return;
    }
    pAVar2 = (Arena *)(this_00->_M_dataplus)._M_p;
    if (pAVar2 != (Arena *)&this_00->field_2) {
      operator_delete(pAVar2,(ulong)((long)&((Rep *)(this_00->field_2)._M_allocated_capacity)->
                                            allocated_size + 1));
    }
    uVar5 = 0x20;
    goto LAB_005e846f;
  }
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x34);
    pLVar4 = LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_59,pLVar4);
    LogMessage::~LogMessage(&local_58);
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4)) {
  case 1:
  case 8:
    this_00 = (string *)(this->field_0).repeated_int32_value;
    if (this_00 == (string *)0x0) {
      return;
    }
    RepeatedField<int>::~RepeatedField((RepeatedField<int> *)this_00);
    break;
  case 2:
    this_00 = (string *)(this->field_0).repeated_int64_value;
    if (this_00 == (string *)0x0) {
      return;
    }
    RepeatedField<long>::~RepeatedField((RepeatedField<long> *)this_00);
    break;
  case 3:
    this_00 = (string *)(this->field_0).repeated_uint32_value;
    if (this_00 == (string *)0x0) {
      return;
    }
    RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)this_00);
    break;
  case 4:
    this_00 = (string *)(this->field_0).repeated_uint64_value;
    if (this_00 == (string *)0x0) {
      return;
    }
    RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)this_00);
    break;
  case 5:
    this_00 = (string *)(this->field_0).repeated_double_value;
    if (this_00 == (string *)0x0) {
      return;
    }
    RepeatedField<double>::~RepeatedField((RepeatedField<double> *)this_00);
    break;
  case 6:
    this_00 = (string *)(this->field_0).repeated_float_value;
    if (this_00 == (string *)0x0) {
      return;
    }
    RepeatedField<float>::~RepeatedField((RepeatedField<float> *)this_00);
    break;
  case 7:
    this_00 = (string *)(this->field_0).repeated_int32_value;
    if (this_00 == (string *)0x0) {
      return;
    }
    pRVar3 = (Rep *)this_00->_M_string_length;
    if ((pRVar3 != (Rep *)0x0) && (pRVar3->arena == (Arena *)0x0)) {
      operator_delete(pRVar3,(long)*(int *)((long)&(this_00->_M_dataplus)._M_p + 4) + 8);
    }
    break;
  case 9:
    this_00 = (this->field_0).string_value;
    if (this_00 == (string *)0x0) {
      return;
    }
    RepeatedPtrFieldBase::
    Destroy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              ((RepeatedPtrFieldBase *)this_00);
    goto LAB_005e8492;
  case 10:
    this_00 = (this->field_0).string_value;
    if (this_00 == (string *)0x0) {
      return;
    }
    RepeatedPtrFieldBase::
    Destroy<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
              ((RepeatedPtrFieldBase *)this_00);
LAB_005e8492:
    uVar5 = 0x18;
    goto LAB_005e846f;
  default:
    goto switchD_005e8302_default;
  }
  uVar5 = 0x10;
LAB_005e846f:
  operator_delete(this_00,uVar5);
switchD_005e8302_default:
  return;
}

Assistant:

void ExtensionSet::Extension::Free() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                          \
      case WireFormatLite::CPPTYPE_##UPPERCASE:                    \
        delete repeated_##LOWERCASE##_value;                       \
        break

      HANDLE_TYPE(  INT32,   int32);
      HANDLE_TYPE(  INT64,   int64);
      HANDLE_TYPE( UINT32,  uint32);
      HANDLE_TYPE( UINT64,  uint64);
      HANDLE_TYPE(  FLOAT,   float);
      HANDLE_TYPE( DOUBLE,  double);
      HANDLE_TYPE(   BOOL,    bool);
      HANDLE_TYPE(   ENUM,    enum);
      HANDLE_TYPE( STRING,  string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    switch (cpp_type(type)) {
      case WireFormatLite::CPPTYPE_STRING:
        delete string_value;
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_lazy) {
          delete lazymessage_value;
        } else {
          delete message_value;
        }
        break;
      default:
        break;
    }
  }
}